

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

stb_vorbis_info * stb_vorbis_get_info(stb_vorbis_info *__return_storage_ptr__,stb_vorbis *f)

{
  stb_vorbis *f_local;
  
  __return_storage_ptr__->channels = f->channels;
  __return_storage_ptr__->sample_rate = f->sample_rate;
  __return_storage_ptr__->setup_memory_required = f->setup_memory_required;
  __return_storage_ptr__->setup_temp_memory_required = f->setup_temp_memory_required;
  __return_storage_ptr__->temp_memory_required = f->temp_memory_required;
  __return_storage_ptr__->max_frame_size = f->blocksize_1 >> 1;
  return __return_storage_ptr__;
}

Assistant:

stb_vorbis_info stb_vorbis_get_info(stb_vorbis *f)
{
   stb_vorbis_info d;
   d.channels = f->channels;
   d.sample_rate = f->sample_rate;
   d.setup_memory_required = f->setup_memory_required;
   d.setup_temp_memory_required = f->setup_temp_memory_required;
   d.temp_memory_required = f->temp_memory_required;
   d.max_frame_size = f->blocksize_1 >> 1;
   return d;
}